

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

bool_t tcsisame_ascii(tchar_t *a,tchar_t *b)

{
  byte bVar1;
  byte bVar2;
  int cb;
  int ca;
  tchar_t *b_local;
  tchar_t *a_local;
  
  _cb = (byte *)b;
  b_local = a;
  while( true ) {
    bVar2 = *b_local;
    bVar1 = bVar2 ^ *_cb;
    if ((bVar1 != 0) &&
       (((bVar2 = bVar2 & 0xdf, (bVar1 & 0xdf) != 0 || ((char)bVar2 < 'A')) || ('Z' < (char)bVar2)))
       ) {
      return 0;
    }
    if (bVar2 == 0) {
      return 1;
    }
    bVar2 = b_local[1];
    bVar1 = bVar2 ^ _cb[1];
    if ((bVar1 != 0) &&
       (((bVar2 = bVar2 & 0xdf, (bVar1 & 0xdf) != 0 || ((char)bVar2 < 'A')) || ('Z' < (char)bVar2)))
       ) {
      return 0;
    }
    if (bVar2 == 0) {
      return 1;
    }
    bVar2 = b_local[2];
    bVar1 = bVar2 ^ _cb[2];
    if ((bVar1 != 0) &&
       (((bVar2 = bVar2 & 0xdf, (bVar1 & 0xdf) != 0 || ((char)bVar2 < 'A')) || ('Z' < (char)bVar2)))
       ) {
      return 0;
    }
    if (bVar2 == 0) {
      return 1;
    }
    bVar2 = b_local[3];
    bVar1 = bVar2 ^ _cb[3];
    if ((bVar1 != 0) &&
       (((bVar2 = bVar2 & 0xdf, (bVar1 & 0xdf) != 0 || ((char)bVar2 < 'A')) || ('Z' < (char)bVar2)))
       ) break;
    if (bVar2 == 0) {
      return 1;
    }
    b_local = b_local + 4;
    _cb = _cb + 4;
  }
  return 0;
}

Assistant:

bool_t tcsisame_ascii(const tchar_t* a,const tchar_t* b)
{
    int ca,cb;
    for (;;a+=4,b+=4)
    {
        isame_ascii(a,b,0)
        isame_ascii(a,b,1)
        isame_ascii(a,b,2)
        isame_ascii(a,b,3)
    }
    return 1;
}